

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

anon_unknown_dwarf_1d643 * __thiscall
anon_unknown.dwarf_1d643::open_input_stream(anon_unknown_dwarf_1d643 *this,char *filename)

{
  undefined8 uVar1;
  _Ios_Iostate __a;
  char *filename_local;
  ifstream *stream;
  
  std::ifstream::ifstream(this);
  uVar1 = *(undefined8 *)(*(long *)this + -0x18);
  __a = std::operator|(_S_eofbit,_S_failbit);
  std::operator|(__a,_S_badbit);
  std::ios::exceptions((int)this + (int)uVar1);
  std::ifstream::open((char *)this,(_Ios_Openmode)filename);
  return this;
}

Assistant:

ifstream open_input_stream(const char* filename)
{
    ifstream stream;
    stream.exceptions(ios::eofbit | ios::failbit | ios::badbit);
    stream.open(filename, mode_input);

    return stream;
}